

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O2

int build_dd(DdManager *table,int num,int lower,int upper)

{
  int iVar1;
  int x;
  int iVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int x_00;
  int index;
  ulong local_38;
  
  if ((computed == (st__table *)0x0) ||
     (iVar1 = st__lookup_int(computed,(char *)(storedd + (long)num * ((long)numvars + 1)),&index),
     iVar1 == 0)) {
    iVar1 = storedd[numvars];
    iVar4 = 0;
    local_38 = (ulong)(uint)lower;
    do {
      iVar5 = (int)local_38;
      if (numvars <= iVar4) break;
      x_00 = table->perm[storedd[(numvars + 1) * num + iVar4]];
      while (x = cuddNextLow(table,x_00), iVar5 + iVar4 <= x) {
        iVar2 = cuddSwapInPlace(table,x,x_00);
        x_00 = x;
        if (iVar2 == 0) {
          return 0;
        }
      }
      iVar4 = iVar4 + 1;
      iVar5 = (int)local_38;
    } while ((int)(table->keys - table->isolated) <= iVar1 * 0x14);
    iVar4 = cuddSifting(table,iVar5,upper);
    piVar3 = storedd;
    iVar1 = numvars;
    if (iVar4 == 0) {
      return 0;
    }
    iVar4 = (numvars + 1) * num;
    uVar6 = 0;
    uVar7 = 0;
    if (0 < numvars) {
      uVar7 = (ulong)(uint)numvars;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      piVar3[(long)iVar4 + uVar6] = table->invperm[(long)iVar5 + uVar6];
    }
    iVar5 = table->keys - table->isolated;
    iVar4 = iVar4 + iVar1;
  }
  else {
    iVar5 = storedd[index * (numvars + 1) + numvars];
    iVar4 = num * (numvars + 1) + numvars;
    piVar3 = storedd;
  }
  piVar3[iVar4] = iVar5;
  return 1;
}

Assistant:

static int
build_dd(
  DdManager * table,
  int  num /* the index of the individual to be built */,
  int  lower,
  int  upper)
{
    int         i,j;            /* loop vars */
    int         position;
    int         index;
    int         limit;          /* how large the DD for this order can grow */
    int         size;

    /* Check the computed table. If the order already exists, it
    ** suffices to copy the size from the existing entry.
    */
    if (computed && st__lookup_int(computed,(char *)&STOREDD(num,0),&index)) {
        STOREDD(num,numvars) = STOREDD(index,numvars);
#ifdef DD_STATS
        (void) fprintf(table->out,"\nCache hit for index %d", index);
#endif
        return(1);
    }

    /* Stop if the DD grows 20 times larges than the reference size. */
    limit = 20 * STOREDD(0,numvars);

    /* Sift up the variables so as to build the desired permutation.
    ** First the variable that has to be on top is sifted to the top.
    ** Then the variable that has to occupy the secon position is sifted
    ** up to the second position, and so on.
    */
    for (j = 0; j < numvars; j++) {
        i = STOREDD(num,j);
        position = table->perm[i];
        result = sift_up(table,position,j+lower);
        if (!result) return(0);
        size = table->keys - table->isolated;
        if (size > limit) break;
    }

    /* Sift the DD just built. */
#ifdef DD_STATS
    (void) fprintf(table->out,"\n");
#endif
    result = cuddSifting(table,lower,upper);
    if (!result) return(0);

    /* Copy order and size to table. */
    for (j = 0; j < numvars; j++) {
        STOREDD(num,j) = table->invperm[lower+j];
    }
    STOREDD(num,numvars) = table->keys - table->isolated; /* size of new DD */
    return(1);

}